

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

type __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,Rml::FilterInstancer*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::doCreateByKey<std::__cxx11::string,Rml::FilterInstancer*>
          (Table<true,80ul,std::__cxx11::string,Rml::FilterInstancer*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  pointer pcVar6;
  FilterInstancer *__n;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  type in_RAX;
  size_t sVar10;
  long lVar11;
  uint uVar12;
  type ppFVar13;
  ulong insertion_idx;
  long lVar14;
  string *this_00;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  paVar1 = &key->field_2;
  do {
    sVar10 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)this,key);
    uVar12 = ((uint)sVar10 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar5 = *(int *)(this + 0x28);
    insertion_idx = sVar10 >> 5 & *(ulong *)(this + 0x18);
    lVar14 = *(long *)(this + 8);
    bVar4 = *(byte *)(lVar14 + insertion_idx);
    while (uVar12 = uVar12 + iVar5, uVar12 < bVar4) {
      pbVar2 = (byte *)(lVar14 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
      bVar4 = *pbVar2;
    }
    if (uVar12 == *(byte *)(lVar14 + insertion_idx)) {
      pcVar6 = (key->_M_dataplus)._M_p;
      __n = (FilterInstancer *)key->_M_string_length;
      ppFVar13 = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
      do {
        if (__n == ppFVar13[-3]) {
          bVar8 = true;
          if (__n == (FilterInstancer *)0x0) goto LAB_0024235b;
          iVar9 = bcmp(pcVar6,ppFVar13[-4],(size_t)__n);
          if (iVar9 == 0) goto LAB_00242359;
        }
        uVar12 = uVar12 + iVar5;
        pbVar2 = (byte *)(lVar14 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        ppFVar13 = ppFVar13 + 5;
      } while (uVar12 == *pbVar2);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar5 + uVar12) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar11 = 1;
      do {
        lVar11 = lVar11 + -1;
        pcVar3 = (char *)(lVar14 + insertion_idx);
        lVar14 = lVar14 + 1;
      } while (*pcVar3 != '\0');
      this_00 = (string *)(insertion_idx * 0x28 + *(long *)this);
      if (lVar11 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar6 = (key->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 == paVar1) {
          uVar7 = *(undefined8 *)((long)&key->field_2 + 8);
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
          *(undefined8 *)(this_00 + 0x18) = uVar7;
        }
        else {
          *(pointer *)this_00 = pcVar6;
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
        }
        *(size_type *)(this_00 + 8) = key->_M_string_length;
        (key->_M_dataplus)._M_p = (pointer)paVar1;
        key->_M_string_length = 0;
        (key->field_2)._M_local_buf[0] = '\0';
        *(undefined8 *)(this_00 + 0x20) = 0;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar11,insertion_idx);
        local_58 = (size_type *)(key->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58 == paVar1) {
          local_48 = paVar1->_M_allocated_capacity;
          uStack_40 = *(undefined8 *)((long)&key->field_2 + 8);
          local_58 = &local_48;
        }
        else {
          local_48 = paVar1->_M_allocated_capacity;
        }
        local_50 = key->_M_string_length;
        (key->_M_dataplus)._M_p = (pointer)paVar1;
        key->_M_string_length = 0;
        (key->field_2)._M_local_buf[0] = '\0';
        local_38 = 0;
        std::__cxx11::string::operator=(this_00,(string *)&local_58);
        *(undefined8 *)(this_00 + 0x20) = local_38;
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48 + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar12;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      ppFVar13 = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
LAB_00242359:
      bVar8 = true;
    }
    else {
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::FilterInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this);
      bVar8 = false;
      ppFVar13 = in_RAX;
    }
LAB_0024235b:
    in_RAX = ppFVar13;
    if (bVar8) {
      return ppFVar13;
    }
  } while( true );
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }